

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool trans_BLX_r(DisasContext_conflict1 *s,arg_BLX_r *a)

{
  ulong uVar1;
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i32 var;
  
  uVar1 = s->features;
  if ((short)uVar1 < 0) {
    tcg_ctx = s->uc->tcg_ctx;
    var = load_reg(s,a->rm);
    tcg_gen_movi_i32(tcg_ctx,tcg_ctx->cpu_R[0xe],s->thumb | (uint)(s->base).pc_next);
    gen_bx(s,var);
  }
  return SUB81((uVar1 & 0xffff) >> 0xf,0);
}

Assistant:

static bool trans_BLX_r(DisasContext *s, arg_BLX_r *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp;

    if (!ENABLE_ARCH_5) {
        return false;
    }
    tmp = load_reg(s, a->rm);
    tcg_gen_movi_i32(tcg_ctx, tcg_ctx->cpu_R[14], s->base.pc_next | s->thumb);
    gen_bx(s, tmp);
    return true;
}